

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdn.c
# Opt level: O2

void Qiniu_Free_CDNLogListRet(Qiniu_CDN_LogListRet *ret)

{
  _Qiniu_CDN_LogListData *addr;
  long lVar1;
  long lVar2;
  
  if (ret->data != (_Qiniu_CDN_LogListData *)0x0) {
    lVar1 = 0x10;
    for (lVar2 = 0; addr = ret->data, lVar2 < ret->domainsCount; lVar2 = lVar2 + 1) {
      if (0 < *(int *)((long)addr + lVar1 + -8)) {
        Qiniu_Free(*(void **)((long)&addr->domain + lVar1));
      }
      lVar1 = lVar1 + 0x18;
    }
    Qiniu_Free(addr);
    return;
  }
  return;
}

Assistant:

void Qiniu_Free_CDNLogListRet(Qiniu_CDN_LogListRet *ret) {
    int i;
    if (ret->data != NULL) {
        for (i = 0; i < ret->domainsCount; i++) {
            if (ret->data[i].itemsCount > 0) {
                Qiniu_Free(ret->data[i].items);
            }
        }
        Qiniu_Free(ret->data);
    }
}